

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_interval.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformInterval(Transformer *this,PGIntervalConstant *node)

{
  int iVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  pointer puVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  PGAConst *pPVar8;
  type expr;
  ParserException *pPVar9;
  InternalException *pIVar10;
  long in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_c8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_c0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  LogicalType target_type;
  string fname;
  LogicalType parse_type;
  
  local_c0._M_head_impl = (ParsedExpression *)0x0;
  iVar1 = *(int *)(in_RDX + 4);
  if (iVar1 == 0xd9) {
    Value::Value((Value *)&fname,*(int32_t *)(in_RDX + 0x10));
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&children,(Value *)&fname);
  }
  else {
    if (iVar1 != 0xdb) {
      if (iVar1 != 0x161) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&fname,"Unsupported interval transformation",(allocator *)&children);
        InternalException::InternalException(pIVar10,&fname);
        __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      TransformExpression((Transformer *)&fname,(optional_ptr<duckdb_libpgquery::PGNode,_true>)node)
      ;
      _Var4 = fname._M_dataplus;
      _Var2._M_head_impl = local_c0._M_head_impl;
      fname._M_dataplus._M_p = (pointer)0x0;
      local_c0._M_head_impl = (ParsedExpression *)_Var4._M_p;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (*((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        if (fname._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)fname._M_dataplus._M_p + 8))();
        }
      }
      goto LAB_00a755f5;
    }
    Value::Value((Value *)&fname,*(char **)(in_RDX + 8));
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&children,(Value *)&fname);
  }
  puVar3 = children.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_head_impl = local_c0._M_head_impl;
  children.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0._M_head_impl = (ParsedExpression *)puVar3;
  if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
    (*((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    if (children.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((children.
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
  }
  children.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Value::~Value((Value *)&fname);
LAB_00a755f5:
  if (*(long *)(in_RDX + 0x20) == 0) {
    make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&fname,&LogicalType::INTERVAL,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_c0);
    (this->parent).ptr = (Transformer *)fname._M_dataplus._M_p;
  }
  else {
    fname._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(in_RDX + 0x20) + 8);
    pPVar8 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator->
                       ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&fname);
    uVar6 = NumericCastImpl<int,_long,_false>::Convert((pPVar8->val).val.ival);
    fname._M_dataplus._M_p = (pointer)&fname.field_2;
    fname._M_string_length = 0;
    fname.field_2._M_local_buf[0] = '\0';
    LogicalType::LogicalType(&parse_type,DOUBLE);
    LogicalType::LogicalType(&target_type);
    uVar7 = ~uVar6;
    if ((uVar7 & 6) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"YEAR TO MONTH is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar7 & 0x408) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"DAY TO HOUR is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar7 & 0x808) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"DAY TO MINUTE is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar7 & 0x1008) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"DAY TO SECOND is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar7 & 0xc00) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"HOUR TO MINUTE is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar7 & 0x1400) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"HOUR TO SECOND is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar7 & 0x1800) == 0) {
      pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&children,"MINUTE TO SECOND is not supported",(allocator *)&local_c8);
      ParserException::ParserException(pPVar9,(string *)&children);
      __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((uVar6 & 4) == 0) {
      if ((uVar6 & 2) == 0) {
        if ((uVar6 & 8) == 0) {
          if ((uVar6 >> 10 & 1) == 0) {
            if ((uVar6 >> 0xb & 1) == 0) {
              if ((uVar6 >> 0xc & 1) == 0) {
                if ((uVar6 >> 0xd & 1) == 0) {
                  if ((uVar6 >> 0xe & 1) == 0) {
                    if ((uVar6 >> 0x18 & 1) == 0) {
                      if ((uVar6 >> 0x1d & 1) == 0) {
                        if ((uVar6 >> 0x19 & 1) == 0) {
                          if ((uVar6 >> 0x1a & 1) == 0) {
                            if ((uVar6 >> 0x1b & 1) == 0) {
                              pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
                              ::std::__cxx11::string::string
                                        ((string *)&children,"Unsupported interval post-fix",
                                         (allocator *)&local_c8);
                              InternalException::InternalException(pIVar10,(string *)&children);
                              __cxa_throw(pIVar10,&InternalException::typeinfo,
                                          ::std::runtime_error::~runtime_error);
                            }
                            ::std::__cxx11::string::assign((char *)&fname);
                            LogicalType::LogicalType((LogicalType *)&children,INTEGER);
                          }
                          else {
                            ::std::__cxx11::string::assign((char *)&fname);
                            LogicalType::LogicalType((LogicalType *)&children,INTEGER);
                          }
                        }
                        else {
                          ::std::__cxx11::string::assign((char *)&fname);
                          LogicalType::LogicalType((LogicalType *)&children,INTEGER);
                        }
                      }
                      else {
                        ::std::__cxx11::string::assign((char *)&fname);
                        LogicalType::LogicalType((LogicalType *)&children,INTEGER);
                      }
                    }
                    else {
                      ::std::__cxx11::string::assign((char *)&fname);
                      LogicalType::LogicalType((LogicalType *)&children,INTEGER);
                    }
                  }
                  else {
                    ::std::__cxx11::string::assign((char *)&fname);
                    LogicalType::LogicalType((LogicalType *)&children,BIGINT);
                  }
                }
                else {
                  ::std::__cxx11::string::assign((char *)&fname);
                  LogicalType::LogicalType((LogicalType *)&children,DOUBLE);
                }
              }
              else {
                ::std::__cxx11::string::assign((char *)&fname);
                LogicalType::LogicalType((LogicalType *)&children,DOUBLE);
              }
            }
            else {
              ::std::__cxx11::string::assign((char *)&fname);
              LogicalType::LogicalType((LogicalType *)&children,BIGINT);
            }
          }
          else {
            ::std::__cxx11::string::assign((char *)&fname);
            LogicalType::LogicalType((LogicalType *)&children,BIGINT);
          }
        }
        else {
          ::std::__cxx11::string::assign((char *)&fname);
          LogicalType::LogicalType((LogicalType *)&children,INTEGER);
        }
      }
      else {
        ::std::__cxx11::string::assign((char *)&fname);
        LogicalType::LogicalType((LogicalType *)&children,INTEGER);
      }
    }
    else {
      ::std::__cxx11::string::assign((char *)&fname);
      LogicalType::LogicalType((LogicalType *)&children,INTEGER);
    }
    LogicalType::operator=(&target_type,(LogicalType *)&children);
    LogicalType::~LogicalType((LogicalType *)&children);
    make_uniq<duckdb::CastExpression,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&children,&parse_type,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_c0);
    puVar3 = children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_head_impl = local_c0._M_head_impl;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0._M_head_impl = (ParsedExpression *)puVar3;
    if ((FunctionExpression *)_Var2._M_head_impl != (FunctionExpression *)0x0) {
      (**(code **)&(((((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        *)&((BaseExpression *)
                           &((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                           _vptr_BaseExpression)->_M_t).
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
      if (children.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((children.
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
    }
    bVar5 = LogicalType::operator!=(&target_type,&parse_type);
    if (bVar5) {
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&children,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_c0);
      make_uniq<duckdb::FunctionExpression,char_const(&)[6],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_c8,(char (*) [6])0x1072d06,&children);
      _Var2._M_head_impl = local_c0._M_head_impl;
      local_c0._M_head_impl = &(local_c8._M_head_impl)->super_ParsedExpression;
      local_c8._M_head_impl = (FunctionExpression *)0x0;
      if ((FunctionExpression *)_Var2._M_head_impl != (FunctionExpression *)0x0) {
        (**(code **)&(((((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          *)&((BaseExpression *)
                             &((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                             _vptr_BaseExpression)->_M_t).
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
        if (local_c8._M_head_impl != (FunctionExpression *)0x0) {
          (**(code **)&(((((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            *)&((local_c8._M_head_impl)->super_ParsedExpression).
                               super_BaseExpression._vptr_BaseExpression)->_M_t).
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
      }
      make_uniq<duckdb::CastExpression,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((duckdb *)&local_c8,&target_type,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_c0);
      _Var2._M_head_impl = local_c0._M_head_impl;
      local_c0._M_head_impl = &(local_c8._M_head_impl)->super_ParsedExpression;
      local_c8._M_head_impl = (FunctionExpression *)0x0;
      if ((FunctionExpression *)_Var2._M_head_impl != (FunctionExpression *)0x0) {
        (*(code *)((Transformer *)
                  ((BaseExpression *)
                  &((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                  _vptr_BaseExpression)->options)();
        if (local_c8._M_head_impl != (FunctionExpression *)0x0) {
          (*(code *)((Transformer *)
                    ((local_c8._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                    _vptr_BaseExpression)->options)();
        }
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&children.
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               );
    }
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_c0);
    make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_c8,&fname,&children);
    expr = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                        *)&local_c8);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x28));
    (this->parent).ptr = (Transformer *)local_c8._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    LogicalType::~LogicalType(&target_type);
    LogicalType::~LogicalType(&parse_type);
    ::std::__cxx11::string::~string((string *)&fname);
  }
  if ((FunctionExpression *)local_c0._M_head_impl != (FunctionExpression *)0x0) {
    (**(code **)((long)(((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          *)&((BaseExpression *)
                             &((local_c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
                             ->_vptr_BaseExpression)->_M_t).
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 8))();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformInterval(duckdb_libpgquery::PGIntervalConstant &node) {
	// handle post-fix notation of INTERVAL

	// three scenarios
	// interval (expr) year
	// interval 'string' year
	// interval int year
	unique_ptr<ParsedExpression> expr;
	switch (node.val_type) {
	case duckdb_libpgquery::T_PGAExpr:
		expr = TransformExpression(node.eval);
		break;
	case duckdb_libpgquery::T_PGString:
		expr = make_uniq<ConstantExpression>(Value(node.sval));
		break;
	case duckdb_libpgquery::T_PGInteger:
		expr = make_uniq<ConstantExpression>(Value(node.ival));
		break;
	default:
		throw InternalException("Unsupported interval transformation");
	}

	if (!node.typmods) {
		return make_uniq<CastExpression>(LogicalType::INTERVAL, std::move(expr));
	}

	int32_t mask = NumericCast<int32_t>(
	    PGPointerCast<duckdb_libpgquery::PGAConst>(node.typmods->head->data.ptr_value)->val.val.ival);
	// these seemingly random constants are from libpg_query/include/utils/datetime.hpp
	// they are copied here to avoid having to include this header
	// the bitshift is from the function INTERVAL_MASK in the parser
	constexpr int32_t MONTH_MASK = 1 << 1;
	constexpr int32_t YEAR_MASK = 1 << 2;
	constexpr int32_t DAY_MASK = 1 << 3;
	constexpr int32_t HOUR_MASK = 1 << 10;
	constexpr int32_t MINUTE_MASK = 1 << 11;
	constexpr int32_t SECOND_MASK = 1 << 12;
	constexpr int32_t MILLISECOND_MASK = 1 << 13;
	constexpr int32_t MICROSECOND_MASK = 1 << 14;
	constexpr int32_t WEEK_MASK = 1 << 24;
	constexpr int32_t DECADE_MASK = 1 << 25;
	constexpr int32_t CENTURY_MASK = 1 << 26;
	constexpr int32_t MILLENNIUM_MASK = 1 << 27;
	constexpr int32_t QUARTER_MASK = 1 << 29;

	// we need to check certain combinations
	// because certain interval masks (e.g. INTERVAL '10' HOURS TO DAYS) set multiple bits
	// for now we don't support all of the combined ones
	// (we might add support if someone complains about it)

	string fname;
	LogicalType parse_type = LogicalType::DOUBLE;
	LogicalType target_type;
	if (mask & YEAR_MASK && mask & MONTH_MASK) {
		// DAY TO HOUR
		throw ParserException("YEAR TO MONTH is not supported");
	} else if (mask & DAY_MASK && mask & HOUR_MASK) {
		// DAY TO HOUR
		throw ParserException("DAY TO HOUR is not supported");
	} else if (mask & DAY_MASK && mask & MINUTE_MASK) {
		// DAY TO MINUTE
		throw ParserException("DAY TO MINUTE is not supported");
	} else if (mask & DAY_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("DAY TO SECOND is not supported");
	} else if (mask & HOUR_MASK && mask & MINUTE_MASK) {
		// DAY TO SECOND
		throw ParserException("HOUR TO MINUTE is not supported");
	} else if (mask & HOUR_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("HOUR TO SECOND is not supported");
	} else if (mask & MINUTE_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("MINUTE TO SECOND is not supported");
	} else if (mask & YEAR_MASK) {
		// YEAR
		fname = "to_years";
		target_type = LogicalType::INTEGER;
	} else if (mask & MONTH_MASK) {
		// MONTH
		fname = "to_months";
		target_type = LogicalType::INTEGER;
	} else if (mask & DAY_MASK) {
		// DAY
		fname = "to_days";
		target_type = LogicalType::INTEGER;
	} else if (mask & HOUR_MASK) {
		// HOUR
		fname = "to_hours";
		target_type = LogicalType::BIGINT;
	} else if (mask & MINUTE_MASK) {
		// MINUTE
		fname = "to_minutes";
		target_type = LogicalType::BIGINT;
	} else if (mask & SECOND_MASK) {
		// SECOND
		fname = "to_seconds";
		target_type = LogicalType::DOUBLE;
	} else if (mask & MILLISECOND_MASK) {
		// MILLISECOND
		fname = "to_milliseconds";
		target_type = LogicalType::DOUBLE;
	} else if (mask & MICROSECOND_MASK) {
		// MICROSECOND
		fname = "to_microseconds";
		target_type = LogicalType::BIGINT;
	} else if (mask & WEEK_MASK) {
		// WEEK
		fname = "to_weeks";
		target_type = LogicalType::INTEGER;
	} else if (mask & QUARTER_MASK) {
		// QUARTER
		fname = "to_quarters";
		target_type = LogicalType::INTEGER;
	} else if (mask & DECADE_MASK) {
		// DECADE
		fname = "to_decades";
		target_type = LogicalType::INTEGER;
	} else if (mask & CENTURY_MASK) {
		// CENTURY
		fname = "to_centuries";
		target_type = LogicalType::INTEGER;
	} else if (mask & MILLENNIUM_MASK) {
		// MILLENNIUM
		fname = "to_millennia";
		target_type = LogicalType::INTEGER;
	} else {
		throw InternalException("Unsupported interval post-fix");
	}
	// first push a cast to the parse type
	expr = make_uniq<CastExpression>(parse_type, std::move(expr));

	// next, truncate it if the target type doesn't match the parse type
	if (target_type != parse_type) {
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(expr));
		expr = make_uniq<FunctionExpression>("trunc", std::move(children));
		expr = make_uniq<CastExpression>(target_type, std::move(expr));
	}
	// now push the operation
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(std::move(expr));
	auto result = make_uniq<FunctionExpression>(fname, std::move(children));
	SetQueryLocation(*result, node.location);
	return std::move(result);
}